

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O3

void multikey_simd<unsigned_int>(uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  uchar *puVar2;
  uint8_t *puVar3;
  uint pivot;
  int iVar4;
  uint uVar5;
  size_t i;
  size_t sVar6;
  void *__src;
  uchar **ppuVar7;
  uchar **ppuVar8;
  byte bVar9;
  byte bVar10;
  long lVar11;
  uint8_t *puVar12;
  ulong n;
  array<unsigned_long,_3UL> bucketsize;
  size_t bucketindex [3];
  char local_8c;
  uint8_t *local_88;
  size_t sStack_80;
  size_t local_78;
  size_t local_70;
  uint8_t *local_68;
  uint8_t *local_60;
  size_t local_58;
  size_t local_50;
  long local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  if (N < 0x20) {
    if (1 < N) {
      ppuVar7 = strings;
      do {
        puVar1 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        for (ppuVar8 = ppuVar7; strings < ppuVar8; ppuVar8 = ppuVar8 + -1) {
          puVar2 = ppuVar8[-1];
          bVar9 = puVar2[depth];
          bVar10 = puVar1[depth];
          if ((bVar9 != 0) && (lVar11 = depth + 1, bVar9 == bVar10)) {
            do {
              bVar9 = puVar2[lVar11];
              bVar10 = puVar1[lVar11];
              if (bVar9 == 0) break;
              lVar11 = lVar11 + 1;
            } while (bVar9 == bVar10);
          }
          if (bVar9 <= bVar10) break;
          *ppuVar8 = puVar2;
        }
        iVar4 = (int)N;
        *ppuVar8 = puVar1;
        N = (size_t)(iVar4 - 1);
      } while (2 < iVar4);
    }
  }
  else {
    pivot = pseudo_median<unsigned_int>(strings,N,depth);
    iVar4 = posix_memalign(&local_88,0x10,N);
    puVar12 = local_88;
    if (iVar4 != 0) {
      puVar12 = (uint8_t *)0x0;
    }
    local_88 = (uint8_t *)0x0;
    sStack_80 = 0;
    local_78 = 0;
    n = N & 0xfffffffffffffff0;
    calculate_bucketsizes_sse<false>(strings,n,puVar12,pivot,depth);
    if (n != N) {
      do {
        puVar1 = strings[n];
        if (puVar1 == (uchar *)0x0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x38,"uint32_t get_char(unsigned char *, size_t)");
        }
        bVar9 = puVar1[depth];
        if (bVar9 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)bVar9 << 0x18;
          if (puVar1[depth + 1] != 0) {
            uVar5 = (uint)bVar9 << 0x18 | (uint)puVar1[depth + 1] << 0x10;
            if (puVar1[depth + 2] != '\0') {
              uVar5 = uVar5 | CONCAT11(puVar1[depth + 2],puVar1[depth + 3]);
            }
          }
        }
        puVar12[n] = (pivot <= uVar5 && uVar5 != pivot) * '\x02' | uVar5 == pivot;
        n = n + 1;
      } while (n < N);
    }
    sVar6 = 0;
    do {
      (&local_88)[puVar12[sVar6]] = (&local_88)[puVar12[sVar6]] + 1;
      puVar3 = local_88;
      sVar6 = sVar6 + 1;
    } while (N != sVar6);
    local_58 = sStack_80;
    local_60 = local_88 + sStack_80;
    local_50 = local_78;
    if (local_60 + local_78 != (uint8_t *)N) {
      __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                    ,0x127,
                    "void multikey_simd(unsigned char **, size_t, size_t) [CharT = unsigned int]");
    }
    local_70 = N * 8;
    __src = malloc(local_70);
    local_48 = 0;
    local_68 = puVar3;
    local_40 = puVar3;
    local_38 = local_60;
    sVar6 = 0;
    do {
      puVar1 = strings[sVar6];
      lVar11 = (&local_48)[puVar12[sVar6]];
      (&local_48)[puVar12[sVar6]] = lVar11 + 1;
      *(uchar **)((long)__src + lVar11 * 8) = puVar1;
      sVar6 = sVar6 + 1;
    } while (N != sVar6);
    memcpy(strings,__src,local_70);
    free(__src);
    free(puVar12);
    puVar12 = local_68;
    multikey_simd<unsigned_int>(strings,(size_t)local_68,depth);
    sVar6 = local_58;
    local_8c = (char)pivot;
    if (local_8c != '\0') {
      multikey_simd<unsigned_int>(strings + (long)puVar12,local_58,depth + 4);
    }
    multikey_simd<unsigned_int>(strings + (long)(puVar12 + sVar6),local_50,depth);
  }
  return;
}

Assistant:

static void
multikey_simd(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	uint8_t* const restrict oracle =
		static_cast<uint8_t*>(_mm_malloc(N, 16));
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<false>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i)
		++bucketsize[oracle[i]];
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	unsigned char** sorted =
		static_cast<unsigned char**>(malloc(N*sizeof(unsigned char*)));
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	free(sorted);
	_mm_free(oracle);
	multikey_simd<CharT>(strings, bucketsize[0], depth);
	if (not is_end(partval))
		multikey_simd<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT));
	multikey_simd<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
}